

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jkGetF0.cc
# Opt level: O0

Frame * sptk::snack::alloc_frame(int nlags,int ncands)

{
  Frame *pFVar1;
  Dprec *pDVar2;
  Cross *pCVar3;
  float *pfVar4;
  short *psVar5;
  int in_ESI;
  int j;
  Frame *frm;
  int local_14;
  
  pFVar1 = (Frame *)ckalloc(0x137f56);
  pDVar2 = (Dprec *)ckalloc(0x137f65);
  pFVar1->dp = pDVar2;
  pFVar1->dp->ncands = 0;
  pCVar3 = (Cross *)ckalloc(0x137f89);
  pFVar1->cp = pCVar3;
  pfVar4 = (float *)ckalloc(0x137fa2);
  pFVar1->cp->correl = pfVar4;
  psVar5 = (short *)ckalloc(0x137fbe);
  pFVar1->dp->locs = psVar5;
  pfVar4 = (float *)ckalloc(0x137fdc);
  pFVar1->dp->pvals = pfVar4;
  pfVar4 = (float *)ckalloc(0x137ffa);
  pFVar1->dp->mpvals = pfVar4;
  psVar5 = (short *)ckalloc(0x138017);
  pFVar1->dp->prept = psVar5;
  pfVar4 = (float *)ckalloc(0x138035);
  pFVar1->dp->dpvals = pfVar4;
  for (local_14 = in_ESI + -1; -1 < local_14; local_14 = local_14 + -1) {
    pFVar1->dp->dpvals[local_14] = 0.0;
  }
  return pFVar1;
}

Assistant:

alloc_frame(int nlags, int ncands)
#endif
{
  Frame *frm;
  int j;

  frm = (Frame*)ckalloc(sizeof(Frame));
  frm->dp = (Dprec *) ckalloc(sizeof(Dprec));
  /*  spsassert(frm->dp,"frm->dp ckalloc failed in alloc_frame");*/
  frm->dp->ncands = 0;
  frm->cp = (Cross *) ckalloc(sizeof(Cross));
  /*  spsassert(frm->cp,"frm->cp ckalloc failed in alloc_frame");*/
  frm->cp->correl = (float *) ckalloc(sizeof(float) * nlags);
  /*  spsassert(frm->cp->correl, "frm->cp->correl ckalloc failed");*/
  /* Allocate space for candidates and working arrays. */
  frm->dp->locs = (short*)ckalloc(sizeof(short) * ncands);
  /*  spsassert(frm->dp->locs,"frm->dp->locs ckalloc failed in alloc_frame()");*/
  frm->dp->pvals = (float*)ckalloc(sizeof(float) * ncands);
/*  spsassert(frm->dp->pvals,"frm->dp->pvals ckalloc failed in alloc_frame()");*/
  frm->dp->mpvals = (float*)ckalloc(sizeof(float) * ncands);
  /*  spsassert(frm->dp->mpvals,"frm->dp->mpvals ckalloc failed in alloc_frame()");*/
  frm->dp->prept = (short*)ckalloc(sizeof(short) * ncands);
  /*  spsassert(frm->dp->prept,"frm->dp->prept ckalloc failed in alloc_frame()");*/
  frm->dp->dpvals = (float*)ckalloc(sizeof(float) * ncands);
  /*  spsassert(frm->dp->dpvals,"frm->dp->dpvals ckalloc failed in alloc_frame()");*/
    
  /*  Initialize the cumulative DP costs to zero */
  for(j = ncands-1; j >= 0; j--)
    frm->dp->dpvals[j] = 0.0;

  return(frm);
}